

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

qint64 QCborValueConstRef::concreteIntegral(QCborValueConstRef self,qint64 defaultValue)

{
  undefined4 uVar1;
  long lVar2;
  const_reference pEVar3;
  qint64 in_RDX;
  long in_FS_OFFSET;
  double dVar4;
  Type t;
  Element e;
  qsizetype in_stack_ffffffffffffffa8;
  Element *in_stack_ffffffffffffffb0;
  qint64 local_20;
  int local_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar3 = QList<QtCbor::Element>::at
                     ((QList<QtCbor::Element> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
  ;
  local_20 = (pEVar3->field_0).value;
  uVar1 = pEVar3->type;
  if (uVar1 == 0x202) {
    dVar4 = QtCbor::Element::fpvalue(in_stack_ffffffffffffffb0);
    local_20 = (qint64)dVar4;
  }
  else if (uVar1 != 0) {
    local_20 = in_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

qint64 QCborValueConstRef::concreteIntegral(QCborValueConstRef self, qint64 defaultValue) noexcept
{
    QtCbor::Element e = self.d->elements.at(self.i);
    QCborValue::Type t = e.type;
    if (t == QCborValue::Double)
        return e.fpvalue();
    if (t != QCborValue::Integer)
        return defaultValue;
    return e.value;
}